

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_visitor.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_json_visitor<char>::byte_string_value<jsoncons::byte_string_view>
          (basic_json_visitor<char> *this,byte_string_view *b,semantic_tag tag,ser_context *context,
          type_conflict param_5)

{
  error_code ec_00;
  bool bVar1;
  uint8_t *data;
  size_t length;
  undefined8 uVar2;
  long *in_RCX;
  undefined1 in_DL;
  byte_string_view *in_RSI;
  long *in_RDI;
  error_code ec;
  error_code *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff98;
  ser_error *in_stack_ffffffffffffffa0;
  byte_string_view local_48;
  error_code local_38;
  long *local_20;
  undefined1 local_11;
  byte_string_view *local_10;
  
  local_20 = in_RCX;
  local_11 = in_DL;
  local_10 = in_RSI;
  std::error_code::error_code(in_stack_ffffffffffffff70);
  data = byte_string_view::data(local_10);
  length = byte_string_view::size(local_10);
  byte_string_view::byte_string_view(&local_48,data,length);
  (**(code **)(*in_RDI + 0x68))(in_RDI,&local_48,local_11,local_20,&local_38);
  bVar1 = std::error_code::operator_cast_to_bool(&local_38);
  if (!bVar1) {
    return true;
  }
  uVar2 = __cxa_allocate_exception(0x58);
  (**(code **)(*local_20 + 0x10))();
  (**(code **)(*local_20 + 0x18))();
  ec_00._4_4_ = local_38._4_4_;
  ec_00._M_value = local_38._M_value;
  ec_00._M_cat._0_4_ = local_38._M_cat._0_4_;
  ec_00._M_cat._4_4_ = local_38._M_cat._4_4_;
  ser_error::ser_error(in_stack_ffffffffffffffa0,ec_00,in_stack_ffffffffffffff98,(size_t)in_RDI);
  __cxa_throw(uVar2,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE byte_string_value(const ByteStringLike& b, 
            semantic_tag tag=semantic_tag::none, 
            const ser_context& context=ser_context(),
            typename std::enable_if<ext_traits::is_byte_sequence<ByteStringLike>::value,int>::type = 0)
        {
            std::error_code ec;
            visit_byte_string(byte_string_view(reinterpret_cast<const uint8_t*>(b.data()),b.size()), tag, context, ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                JSONCONS_THROW(ser_error(ec, context.line(), context.column()));
            }
            JSONCONS_VISITOR_RETURN;
        }